

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cellml_1_0.cpp
# Opt level: O2

void __thiscall
ParserTransform_emptyCellml10_Test::~ParserTransform_emptyCellml10_Test
          (ParserTransform_emptyCellml10_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParserTransform, emptyCellml10)
{
    const std::string e = "Given model is a CellML 1.0 model, the parser will try to represent this model in CellML 2.0.";
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/1.0#\"/>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create(false);
    libcellml::ModelPtr model = parser->parseModel(in);
    EXPECT_EQ(size_t(1), parser->issueCount());
    EXPECT_EQ(libcellml::Issue::Level::MESSAGE, parser->issue(0)->level());
    EXPECT_EQ(e, parser->issue(0)->description());
}